

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O1

size_type __thiscall
google::sparsehash_internal::
sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::min_buckets
          (sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4> *this,
          size_type num_elts,size_type min_buckets_wanted)

{
  size_type sVar1;
  length_error *this_00;
  ulong uVar2;
  float fVar3;
  
  sVar1 = 4;
  do {
    if (min_buckets_wanted <= sVar1) {
      if ((long)sVar1 < 0) {
        fVar3 = (float)(sVar1 >> 1) + (float)(sVar1 >> 1);
      }
      else {
        fVar3 = (float)(long)sVar1;
      }
      fVar3 = fVar3 * this->enlarge_factor_;
      uVar2 = (ulong)fVar3;
      if (num_elts < ((long)(fVar3 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2)) {
        return sVar1;
      }
    }
    if ((long)sVar1 < 0) {
      this_00 = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this_00,"resize overflow");
      __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    sVar1 = sVar1 * 2;
  } while( true );
}

Assistant:

float enlarge_factor() const { return enlarge_factor_; }